

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *fnameSessions)

{
  bool bVar1;
  vector<char,_std::allocator<char>_> *list;
  ImDrawListSharedData *drawListSharedData;
  pointer pvVar2;
  pointer pcVar3;
  uint fid;
  pointer pbVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Session session;
  vector<ImDrawList,_std::allocator<ImDrawList>_> drawLists;
  ImDrawData drawData;
  XorRlePerDrawListWithVtxOffset compressor;
  Session local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f0;
  vector<ImDrawList,_std::allocator<ImDrawList>_> local_e8;
  double local_c8;
  double dStack_c0;
  ImDrawData local_b8;
  XorRlePerDrawListWithVtxOffset local_88;
  
  printf("[+] Running benchmark for compressor \'%s\'\n","XorRlePerDrawListWithVtxOffset");
  pbVar4 = (fnameSessions->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(fnameSessions->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) >> 5)) {
    lVar6 = 0;
    local_f0 = fnameSessions;
    do {
      printf("[+] Processing session \'%s\' ...\n",pbVar4[lVar6]._M_dataplus._M_p);
      local_108.frames.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.frames.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.frames.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = Session::load(&local_108,pbVar4[lVar6]._M_dataplus._M_p);
      if (bVar1) {
        local_b8.DisplaySize.x = 0.0;
        local_b8.DisplaySize.y = 0.0;
        local_b8.FramebufferScale.x = 0.0;
        local_b8.FramebufferScale.y = 0.0;
        local_b8.CmdLists = (ImDrawList **)0x0;
        local_b8.DisplayPos.x = 0.0;
        local_b8.DisplayPos.y = 0.0;
        local_b8.Valid = false;
        local_b8._1_3_ = 0;
        local_b8.CmdListsCount = 0;
        local_b8.TotalIdxCount = 0;
        local_b8.TotalVtxCount = 0;
        local_e8.super__Vector_base<ImDrawList,_std::allocator<ImDrawList>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.super__Vector_base<ImDrawList,_std::allocator<ImDrawList>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.super__Vector_base<ImDrawList,_std::allocator<ImDrawList>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::XorRlePerDrawListWithVtxOffset
                  (&local_88);
        fid = 0;
        uVar5 = 0;
        while( true ) {
          drawListSharedData = ImGui::GetDrawListSharedData();
          bVar1 = Session::getFrame(&local_108,fid,&local_b8,&local_e8,drawListSharedData);
          if (!bVar1) break;
          bVar1 = ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::setDrawData
                            (&local_88,&local_b8);
          if (!bVar1) {
            fprintf(_stderr,"    [E] Failed setting draw data for frame %d\n",(ulong)fid);
            break;
          }
          pcVar3 = (pointer)0x0;
          for (pvVar2 = local_88.super_Interface.m_drawListsDiff.
                        super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar2 != local_88.super_Interface.m_drawListsDiff.
                        super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; pvVar2 = pvVar2 + 1) {
            pcVar3 = (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish +
                     ((long)pcVar3 -
                     (long)(pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start);
          }
          uVar5 = uVar5 + (long)pcVar3;
          fid = fid + 1;
        }
        printf("    - Compressed size   = %d bytes\n",uVar5 & 0xffffffff);
        if (local_108.frames.
            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_108.frames.
            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          dVar7 = 0.0;
        }
        else {
          pcVar3 = (pointer)0x0;
          pvVar2 = local_108.frames.
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar3 = (pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish +
                     ((long)pcVar3 -
                     (long)(pvVar2->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start);
            pvVar2 = pvVar2 + 1;
          } while (pvVar2 != local_108.frames.
                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          auVar8._8_4_ = (int)((ulong)pcVar3 >> 0x20);
          auVar8._0_8_ = pcVar3;
          auVar8._12_4_ = 0x45300000;
          dVar7 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)pcVar3) - 4503599627370496.0);
        }
        auVar9._8_4_ = (int)(uVar5 >> 0x20);
        auVar9._0_8_ = uVar5;
        auVar9._12_4_ = 0x45300000;
        dStack_c0 = auVar9._8_8_ - 1.9342813113834067e+25;
        local_c8 = dStack_c0 + ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
        printf("    - Compression ratio = %6.4f times\n",dVar7 / local_c8);
        printf("    - Average bandwidth = %6.4f kB/s (at 60.0 fps)\n",
               (60.0 / (double)((int)((ulong)((long)local_108.frames.
                                                                                                        
                                                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_108.frames.
                                                                                                      
                                                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                               -0x55555555)) * local_c8 * 0.0009765625);
        putchar(10);
        ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::~XorRlePerDrawListWithVtxOffset
                  (&local_88);
        std::vector<ImDrawList,_std::allocator<ImDrawList>_>::~vector(&local_e8);
      }
      else {
        benchmark<ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset>();
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector(&local_108.frames);
      lVar6 = lVar6 + 1;
      pbVar4 = (local_f0->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar6 < (int)((ulong)((long)(local_f0->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4)
                          >> 5));
  }
  return true;
}

Assistant:

bool benchmark(const std::vector<std::string> & fnameSessions) {
    printf("[+] Running benchmark for compressor '%s'\n", T::kName);

    for (int i = 0; i < (int) fnameSessions.size(); ++i) {
        auto & fname = fnameSessions[i];

        printf("[+] Processing session '%s' ...\n", fname.c_str());

        Session session;
        if (session.load(fname.c_str()) == false) {
            fprintf(stderr, "    [E] Failed reading the file. Probably not an ImDrawData session file?\n");
            continue;
        }

        int fid = 0;
        ImDrawData drawData;
        std::vector<ImDrawList> drawLists;

        T compressor;
        uint64_t compressedSize_bytes = 0;
        while (session.getFrame(fid, &drawData, drawLists, ImGui::GetDrawListSharedData())) {
            if (compressor.setDrawData(&drawData) == false) {
                fprintf(stderr, "    [E] Failed setting draw data for frame %d\n", fid);
                break;
            }

            compressedSize_bytes += compressor.diffSize();

            ++fid;
        }

        printf("    - Compressed size   = %d bytes\n", (int) compressedSize_bytes);
        printf("    - Compression ratio = %6.4f times\n", ((double)(session.totalSize_bytes()))/compressedSize_bytes);
        printf("    - Average bandwidth = %6.4f kB/s (at 60.0 fps)\n", ((double)(compressedSize_bytes))/1024.0*(60.0/session.nFrames()));
        printf("\n");
    }

    return true;
}